

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinPW91_LDA_RPA>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double e;
  double v_b;
  double v_a;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  if (0 < N) {
    lVar3 = 0;
    dVar4 = scal_fact;
    dVar7 = scal_fact;
    local_58 = scal_fact;
    dStack_50 = scal_fact;
    local_48 = scal_fact;
    do {
      dVar5 = *(double *)((long)rho + lVar3 * 2);
      dVar6 = *(double *)((long)rho + lVar3 * 2 + 8);
      if (dVar5 + dVar6 <= 1e-24) {
        dVar5 = 0.0;
        dVar6 = 0.0;
        dVar8 = 0.0;
      }
      else {
        dVar4 = 1e-24;
        if (1e-24 <= dVar5) {
          dVar4 = dVar5;
        }
        dVar7 = 1e-24;
        if (1e-24 <= dVar6) {
          dVar7 = dVar6;
        }
        kernel_traits<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_vxc_polar_impl
                  (dVar4,dVar7,&local_70,&local_60,&local_68);
        dVar5 = local_60;
        dVar6 = local_68;
        dVar8 = local_70;
        scal_fact = local_48;
        dVar4 = local_58;
        dVar7 = dStack_50;
      }
      *(double *)((long)eps + lVar3) = dVar8 * scal_fact + *(double *)((long)eps + lVar3);
      pdVar1 = (double *)((long)vxc + lVar3 * 2);
      dVar8 = pdVar1[1];
      pdVar2 = (double *)((long)vxc + lVar3 * 2);
      *pdVar2 = *pdVar1 + dVar5 * dVar4;
      pdVar2[1] = dVar8 + dVar6 * dVar7;
      lVar3 = lVar3 + 8;
    } while ((ulong)(uint)N << 3 != lVar3);
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;
    auto vxc_i = vxc + 2*i;

    double v_a, v_b, e;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], e, v_a, v_b);
    eps[i]   += scal_fact * e;
    vxc_i[0] += scal_fact * v_a;
    vxc_i[1] += scal_fact * v_b;

  }

}